

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86inst.cpp
# Opt level: O1

uint32_t asmjit::X86Inst::getIdByName(char *name,size_t len)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined1 *puVar5;
  long lVar6;
  int unaff_EBP;
  ulong uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  
  if (name != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(name);
    }
    if ((0xffffffffffffffef < len - 0x11) && (uVar4 = (int)*name - 0x61, uVar4 < 0x1a)) {
      uVar8 = (ulong)*(ushort *)(X86InstNameAZ + (ulong)uVar4 * 4);
      if ((uVar8 != 0) &&
         (uVar7 = *(ushort *)(X86InstNameAZ + (ulong)uVar4 * 4 + 2) - uVar8, uVar7 != 0)) {
        puVar5 = X86InstDB::instData;
        puVar9 = X86InstDB::instData + uVar8 * 0xc;
        do {
          lVar6 = (uVar7 >> 1) * 0xc;
          uVar8 = (ulong)(*(uint *)(puVar9 + lVar6) >> 8 & 0x3fff);
          bVar1 = len != 0;
          if ((len != 0) &&
             (unaff_EBP = (uint)(byte)(&X86InstDB::nameData)[uVar8] - (uint)(byte)*name,
             (&X86InstDB::nameData)[uVar8] == *name)) {
            uVar2 = 1;
            do {
              uVar10 = uVar2;
              iVar3 = unaff_EBP;
              if (len == uVar10) break;
              uVar2 = uVar10 + 1;
              iVar3 = (uint)(byte)(&X86InstDB::nameData)[uVar8 + uVar10] - (uint)(byte)name[uVar10];
            } while ((&X86InstDB::nameData)[uVar8 + uVar10] == name[uVar10]);
            unaff_EBP = iVar3;
            bVar1 = uVar10 < len;
          }
          if (!bVar1) {
            unaff_EBP = (int)(char)(&X86InstDB::nameData)[uVar8 + len];
          }
          if (unaff_EBP < 0) {
            puVar9 = puVar9 + lVar6 + 0xc;
            uVar8 = uVar7 - 1;
            bVar1 = true;
          }
          else {
            bVar1 = true;
            uVar8 = uVar7;
            if (unaff_EBP == 0) {
              puVar5 = (undefined1 *)((long)(puVar9 + lVar6 + -0x18f580) / 0xc);
              bVar1 = false;
            }
          }
          if (!bVar1) {
            return (uint32_t)puVar5;
          }
          uVar7 = uVar8 >> 1;
        } while (1 < uVar8);
      }
    }
  }
  return 0;
}

Assistant:

uint32_t X86Inst::getIdByName(const char* name, size_t len) noexcept {
  if (ASMJIT_UNLIKELY(!name))
    return Inst::kIdNone;

  if (len == Globals::kInvalidIndex)
    len = ::strlen(name);

  if (ASMJIT_UNLIKELY(len == 0 || len > kX86InstMaxLength))
    return Inst::kIdNone;

  uint32_t prefix = static_cast<uint32_t>(name[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  uint32_t index = X86InstNameAZ[prefix].start;
  if (ASMJIT_UNLIKELY(!index))
    return Inst::kIdNone;

  const char* nameData = X86InstDB::nameData;
  const X86Inst* instData = X86InstDB::instData;

  const X86Inst* base = instData + index;
  const X86Inst* end  = instData + X86InstNameAZ[prefix].end;

  for (size_t lim = (size_t)(end - base); lim != 0; lim >>= 1) {
    const X86Inst* cur = base + (lim >> 1);
    int result = Utils::cmpInstName(nameData + cur[0].getNameDataIndex(), name, len);

    if (result < 0) {
      base = cur + 1;
      lim--;
      continue;
    }

    if (result > 0)
      continue;

    return static_cast<uint32_t>((size_t)(cur - instData));
  }

  return Inst::kIdNone;
}